

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

void __thiscall Order_func_Test::TestBody(Order_func_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  double __x;
  double __x_00;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  shared_ptr<const_mathiu::impl::Expr> local_b0;
  ExprPtr local_a0;
  ExprPtr local_90;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  ExprPtr n2;
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [8];
  ExprPtr x;
  Order_func_Test *this_local;
  
  x.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"x",&local_41);
  mathiu::impl::symbol((impl *)local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  mathiu::impl::operator____i((impl *)&gtest_ar_.message_,2);
  mathiu::impl::sin((impl *)&local_90,__x);
  mathiu::impl::operator^((impl *)&local_b0,(ExprPtr *)local_20,(ExprPtr *)&gtest_ar_.message_);
  mathiu::impl::sin((impl *)&local_a0,__x_00);
  local_79 = mathiu::impl::less(&local_90,&local_a0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_a0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_b0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_78,(AssertionResult *)"less(sin(x), sin(x^n2))","false",
               "true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/order.cpp"
               ,0x7f,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar_.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_20);
  return;
}

Assistant:

TEST(Order, func)
{
    auto const x = symbol("x");
    auto const n2 = 2_i;
    EXPECT_TRUE(less(sin(x), sin(x^n2)));
}